

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

int __thiscall
cmMakefile::ConfigureFile
          (cmMakefile *this,char *infile,char *outfile,bool copyonly,bool atOnly,bool escapeQuotes,
          cmNewLineStyle *newLine)

{
  _Alloc_hider _Var1;
  bool bVar2;
  BOM BVar3;
  long lVar4;
  size_t sVar5;
  char *m3;
  uint uVar6;
  char *m1;
  _Ios_Openmode _Var7;
  mode_t perm;
  string soutfile;
  string tempOutputFile;
  string sinfile;
  string newLineCharacters;
  string path;
  string inLine;
  ofstream fout;
  string local_658;
  mode_t local_634;
  string local_630;
  string local_610;
  value_type local_5f0;
  char *local_5d0;
  char *local_5c8;
  char local_5c0;
  undefined7 uStack_5bf;
  string local_5b0;
  byte abStack_590 [488];
  undefined1 local_3a8 [112];
  ios_base local_338 [264];
  undefined1 local_230 [32];
  byte abStack_210 [216];
  ios_base local_138 [264];
  
  bVar2 = CanIWriteThisFile(this,outfile);
  if (bVar2) {
    bVar2 = cmsys::SystemTools::FileExists(infile);
    if (bVar2) {
      std::__cxx11::string::string((string *)&local_630,outfile,(allocator *)&local_5b0);
      std::__cxx11::string::string((string *)&local_5f0,infile,(allocator *)&local_5b0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->ListFiles,&local_5f0);
      cmsys::SystemTools::ConvertToUnixSlashes(&local_630);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->OutputFiles,&local_630);
      local_634 = 0;
      cmsys::SystemTools::GetPermissions(local_5f0._M_dataplus._M_p,&local_634);
      lVar4 = std::__cxx11::string::rfind((char)&local_630,0x2f);
      if (lVar4 != -1) {
        std::__cxx11::string::substr((ulong)&local_5b0,(ulong)&local_630);
        cmsys::SystemTools::MakeDirectory(local_5b0._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5b0._M_dataplus._M_p != &local_5b0.field_2) {
          operator_delete(local_5b0._M_dataplus._M_p,local_5b0.field_2._M_allocated_capacity + 1);
        }
      }
      if (copyonly) {
        bVar2 = cmSystemTools::CopyFileIfDifferent
                          (local_5f0._M_dataplus._M_p,local_630._M_dataplus._M_p);
        uVar6 = 1;
      }
      else {
        local_5d0 = &local_5c0;
        local_5c8 = (char *)0x0;
        local_5c0 = '\0';
        bVar2 = cmNewLineStyle::IsValid(newLine);
        if (bVar2) {
          cmNewLineStyle::GetCharacters_abi_cxx11_(&local_5b0,newLine);
          std::__cxx11::string::_M_assign((string *)&local_5d0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_5b0._M_dataplus._M_p != &local_5b0.field_2) {
            operator_delete(local_5b0._M_dataplus._M_p,local_5b0.field_2._M_allocated_capacity + 1);
          }
          _Var7 = _S_trunc|_S_out|_S_bin;
        }
        else {
          _Var7 = _S_trunc|_S_out;
          std::__cxx11::string::_M_replace((ulong)&local_5d0,0,local_5c8,0x50c4b9);
        }
        local_610._M_dataplus._M_p = (pointer)&local_610.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_610,local_630._M_dataplus._M_p,
                   local_630._M_dataplus._M_p + local_630._M_string_length);
        std::__cxx11::string::append((char *)&local_610);
        std::ofstream::ofstream(local_230,local_610._M_dataplus._M_p,_Var7);
        if ((abStack_210[(long)*(_func_int **)(local_230._0_8_ + -0x18)] & 5) == 0) {
          std::ifstream::ifstream(&local_5b0,local_5f0._M_dataplus._M_p,_S_in);
          if ((abStack_590[*(long *)(local_5b0._M_dataplus._M_p + -0x18)] & 5) == 0) {
            BVar3 = cmsys::FStream::ReadBOM((istream *)&local_5b0);
            if (BVar3 < BOM_UTF16BE) {
              std::istream::seekg(&local_5b0,0,0);
              local_3a8._0_8_ = local_3a8 + 0x10;
              local_3a8._8_8_ = 0;
              local_3a8[0x10] = '\0';
              local_658._M_dataplus._M_p = (pointer)&local_658.field_2;
              local_658._M_string_length = 0;
              local_658.field_2._M_local_buf[0] = '\0';
              while (bVar2 = cmsys::SystemTools::GetLineFromStream
                                       ((istream *)&local_5b0,(string *)local_3a8,(bool *)0x0,-1),
                    bVar2) {
                std::__cxx11::string::_M_replace
                          ((ulong)&local_658,0,(char *)local_658._M_string_length,0x50ea83);
                ConfigureString(this,(string *)local_3a8,&local_658,atOnly,escapeQuotes);
                _Var1._M_p = local_658._M_dataplus._M_p;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_658._M_dataplus._M_p ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0) {
                  std::ios::clear((int)&local_658 + (int)*(_func_int **)(local_230._0_8_ + -0x18) +
                                  0x428);
                }
                else {
                  sVar5 = strlen(local_658._M_dataplus._M_p);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_230,_Var1._M_p,sVar5);
                }
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_230,local_5d0,(long)local_5c8);
              }
              std::ifstream::close();
              std::ofstream::close();
              bVar2 = cmSystemTools::CopyFileIfDifferent
                                (local_610._M_dataplus._M_p,local_630._M_dataplus._M_p);
              if (bVar2) {
                cmsys::SystemTools::SetPermissions(local_630._M_dataplus._M_p,local_634,false);
              }
              uVar6 = (uint)bVar2;
              cmsys::SystemTools::RemoveFile(&local_610);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_658._M_dataplus._M_p != &local_658.field_2) {
                operator_delete(local_658._M_dataplus._M_p,
                                CONCAT71(local_658.field_2._M_allocated_capacity._1_7_,
                                         local_658.field_2._M_local_buf[0]) + 1);
              }
              if ((undefined1 *)local_3a8._0_8_ != local_3a8 + 0x10) {
                operator_delete((void *)local_3a8._0_8_,
                                CONCAT71(local_3a8._17_7_,local_3a8[0x10]) + 1);
              }
              bVar2 = true;
            }
            else {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3a8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_3a8,
                         "File starts with a Byte-Order-Mark that is not UTF-8:\n  ",0x38);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_3a8,local_5f0._M_dataplus._M_p,local_5f0._M_string_length)
              ;
              std::__cxx11::stringbuf::str();
              IssueMessage(this,FATAL_ERROR,&local_658,false);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_658._M_dataplus._M_p != &local_658.field_2) {
                operator_delete(local_658._M_dataplus._M_p,
                                CONCAT71(local_658.field_2._M_allocated_capacity._1_7_,
                                         local_658.field_2._M_local_buf[0]) + 1);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3a8);
              std::ios_base::~ios_base(local_338);
              uVar6 = 1;
              bVar2 = false;
            }
          }
          else {
            bVar2 = false;
            cmSystemTools::Error
                      ("Could not open file for read in copy operation ",local_5f0._M_dataplus._M_p,
                       (char *)0x0,(char *)0x0);
            uVar6 = 1;
          }
          std::ifstream::~ifstream(&local_5b0);
        }
        else {
          cmSystemTools::Error
                    ("Could not open file for write in copy operation ",local_610._M_dataplus._M_p,
                     (char *)0x0,(char *)0x0);
          cmSystemTools::ReportLastSystemError("");
          uVar6 = 1;
          bVar2 = false;
        }
        local_230._0_8_ = _VTT;
        *(undefined8 *)(local_230 + (long)_VTT[-3]) = _getsockopt;
        std::filebuf::~filebuf((filebuf *)(local_230 + 8));
        std::ios_base::~ios_base(local_138);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_610._M_dataplus._M_p != &local_610.field_2) {
          operator_delete(local_610._M_dataplus._M_p,local_610.field_2._M_allocated_capacity + 1);
        }
        if (local_5d0 != &local_5c0) {
          operator_delete(local_5d0,CONCAT71(uStack_5bf,local_5c0) + 1);
        }
      }
      if (!bVar2) {
        uVar6 = 0;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5f0._M_dataplus._M_p != &local_5f0.field_2) {
        operator_delete(local_5f0._M_dataplus._M_p,local_5f0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_630._M_dataplus._M_p == &local_630.field_2) {
        return uVar6;
      }
      operator_delete(local_630._M_dataplus._M_p,local_630.field_2._M_allocated_capacity + 1);
      return uVar6;
    }
    m1 = "File ";
    m3 = " does not exist.";
  }
  else {
    m1 = "Attempt to write file: ";
    m3 = " into a source directory.";
    infile = outfile;
  }
  cmSystemTools::Error(m1,infile,m3,(char *)0x0);
  return 0;
}

Assistant:

int cmMakefile::ConfigureFile(const char* infile, const char* outfile,
                              bool copyonly, bool atOnly, bool escapeQuotes,
                              const cmNewLineStyle& newLine)
{
  int res = 1;
  if ( !this->CanIWriteThisFile(outfile) )
    {
    cmSystemTools::Error("Attempt to write file: ",
                         outfile, " into a source directory.");
    return 0;
    }
  if ( !cmSystemTools::FileExists(infile) )
    {
    cmSystemTools::Error("File ", infile, " does not exist.");
    return 0;
    }
  std::string soutfile = outfile;
  std::string sinfile = infile;
  this->AddCMakeDependFile(sinfile);
  cmSystemTools::ConvertToUnixSlashes(soutfile);

  // Re-generate if non-temporary outputs are missing.
  //when we finalize the configuration we will remove all
  //output files that now don't exist.
  this->AddCMakeOutputFile(soutfile);

  mode_t perm = 0;
  cmSystemTools::GetPermissions(sinfile.c_str(), perm);
  std::string::size_type pos = soutfile.rfind('/');
  if(pos != std::string::npos)
    {
    std::string path = soutfile.substr(0, pos);
    cmSystemTools::MakeDirectory(path.c_str());
    }

  if(copyonly)
    {
    if ( !cmSystemTools::CopyFileIfDifferent(sinfile.c_str(),
                                             soutfile.c_str()))
      {
      return 0;
      }
    }
  else
    {
    std::string newLineCharacters;
    std::ios_base::openmode omode = std::ios_base::out | std::ios_base::trunc;
    if (newLine.IsValid())
      {
      newLineCharacters = newLine.GetCharacters();
      omode |= std::ios::binary;
      }
    else
      {
      newLineCharacters = "\n";
      }
    std::string tempOutputFile = soutfile;
    tempOutputFile += ".tmp";
    cmsys::ofstream fout(tempOutputFile.c_str(), omode);
    if(!fout)
      {
      cmSystemTools::Error(
        "Could not open file for write in copy operation ",
        tempOutputFile.c_str());
      cmSystemTools::ReportLastSystemError("");
      return 0;
      }
    cmsys::ifstream fin(sinfile.c_str());
    if(!fin)
      {
      cmSystemTools::Error("Could not open file for read in copy operation ",
                           sinfile.c_str());
      return 0;
      }

    cmsys::FStream::BOM bom = cmsys::FStream::ReadBOM(fin);
    if(bom != cmsys::FStream::BOM_None &&
       bom != cmsys::FStream::BOM_UTF8)
      {
      std::ostringstream e;
      e << "File starts with a Byte-Order-Mark that is not UTF-8:\n  "
        << sinfile;
      this->IssueMessage(cmake::FATAL_ERROR, e.str());
      return 0;
      }
    // rewind to copy BOM to output file
    fin.seekg(0);


    // now copy input to output and expand variables in the
    // input file at the same time
    std::string inLine;
    std::string outLine;
    while( cmSystemTools::GetLineFromStream(fin, inLine) )
      {
      outLine = "";
      this->ConfigureString(inLine, outLine, atOnly, escapeQuotes);
      fout << outLine.c_str() << newLineCharacters;
      }
    // close the files before attempting to copy
    fin.close();
    fout.close();
    if ( !cmSystemTools::CopyFileIfDifferent(tempOutputFile.c_str(),
                                             soutfile.c_str()) )
      {
      res = 0;
      }
    else
      {
      cmSystemTools::SetPermissions(soutfile.c_str(), perm);
      }
    cmSystemTools::RemoveFile(tempOutputFile);
    }
  return res;
}